

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

int string_cmp_string(http_string_t string_a,http_string_t string_b)

{
  int iVar1;
  undefined1 local_29;
  http_string_t string_b_local;
  http_string_t string_a_local;
  
  local_29 = false;
  if (string_a.len == string_b.len) {
    iVar1 = nh_string_cmp(string_a.value,string_b.value,(int)string_a.len);
    local_29 = iVar1 != 0;
  }
  return (int)local_29;
}

Assistant:

int string_cmp_string(http_string_t string_a, http_string_t string_b) {
    return string_a.len == string_b.len && nh_string_cmp(string_a.value, string_b.value, string_a.len);
}